

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theme.cpp
# Opt level: O3

float __thiscall gui::Theme::computeTextMaxHeightRatio(Theme *this,Font *font)

{
  uint uVar1;
  char c;
  char cVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  FloatRect FVar3;
  string characterSample;
  Text text;
  locale local_200 [8];
  string local_1f8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [24];
  String local_1b0;
  Text local_190;
  
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"");
  cVar2 = ' ';
  do {
    std::__cxx11::string::push_back((char)&local_1f8);
    cVar2 = cVar2 + '\x01';
  } while (cVar2 != '\x7f');
  std::locale::locale(local_200);
  sf::String::String(&local_1b0,&local_1f8,local_200);
  sf::Text::Text(&local_190,&local_1b0,font,0x1e);
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_1b0.m_string._M_dataplus._M_p != &local_1b0.m_string.field_2) {
    operator_delete(local_1b0.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(local_200);
  FVar3 = sf::Text::getLocalBounds(&local_190);
  local_1c8._8_4_ = extraout_XMM0_Dc;
  local_1c8._0_8_ = FVar3._0_8_;
  local_1c8._12_4_ = extraout_XMM0_Dd;
  local_1d8._8_4_ = in_XMM1_Dc;
  local_1d8._0_8_ = FVar3._8_8_;
  local_1d8._12_4_ = in_XMM1_Dd;
  uVar1 = sf::Text::getCharacterSize(&local_190);
  local_190.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Text_001e7638;
  local_190.super_Transformable._vptr_Transformable = (_func_int **)&PTR__Text_001e7660;
  local_190.m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e76b8;
  if (local_190.m_outlineVertices.m_vertices.
      super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_190.m_outlineVertices.m_vertices.
                    super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_190.m_vertices.super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_001e76b8;
  if (local_190.m_vertices.m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_190.m_vertices.m_vertices.
                    super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_190.m_string.m_string._M_dataplus._M_p != &local_190.m_string.m_string.field_2) {
    operator_delete(local_190.m_string.m_string._M_dataplus._M_p);
  }
  sf::Transformable::~Transformable(&local_190.super_Transformable);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  return ((float)local_1c8._4_4_ + (float)local_1d8._4_4_) / (float)uVar1;
}

Assistant:

float Theme::computeTextMaxHeightRatio(const sf::Font& font) const {
    std::string characterSample = "";
    for (char c = '\u0020'; c < '\u007f'; ++c) {
        characterSample.push_back(c);
    }
    GUI_DEBUG << "characterSample = [" << characterSample << "]\n";

    sf::Text text(characterSample, font);
    const auto bounds = text.getLocalBounds();
    return (bounds.top + bounds.height) / text.getCharacterSize();
}